

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

void __thiscall QLineEditPrivate::selectionChanged(QLineEditPrivate *this)

{
  bool bVar1;
  int position;
  QWidgetLineControl *this_00;
  QStyle *pQVar2;
  QLineEditPrivate *in_RDI;
  long in_FS_OFFSET;
  bool showCursor;
  QLineEdit *q;
  QAccessibleTextSelectionEvent ev;
  QStyleOptionFrame opt;
  QWidgetLineControl *in_stack_ffffffffffffff18;
  QWidgetLineControl *in_stack_ffffffffffffff20;
  QAccessibleTextCursorEvent *this_01;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetLineControl *)q_func(in_RDI);
  QWidgetLineControl::preeditAreaText(in_stack_ffffffffffffff18);
  bVar1 = QString::isEmpty((QString *)0x5d16c8);
  QString::~QString((QString *)0x5d16d6);
  if (bVar1) {
    memset(local_58,0xaa,0x50);
    QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x5d1707);
    (**(code **)(*(long *)this_00 + 0x1a0))(this_00,local_58);
    bVar1 = QWidgetLineControl::hasSelectedText(in_stack_ffffffffffffff20);
    if (bVar1) {
      pQVar2 = QWidget::style((QWidget *)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff3c =
           (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x1c,local_58,this_00,0);
    }
    else {
      bVar1 = QWidget::hasFocus((QWidget *)
                                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      in_stack_ffffffffffffff3c = (uint)bVar1;
    }
    setCursorVisible(in_RDI,SUB41(in_stack_ffffffffffffff3c >> 0x18,0));
    QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x5d17a8);
  }
  QLineEdit::selectionChanged((QLineEdit *)0x5d17b2);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetLineControl::selectionStart(this_00);
  QWidgetLineControl::selectionEnd(this_00);
  this_01 = (QAccessibleTextCursorEvent *)&local_88;
  QAccessibleTextSelectionEvent::QAccessibleTextSelectionEvent
            ((QAccessibleTextSelectionEvent *)in_RDI,
             (QObject *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (int)((ulong)this_01 >> 0x20),(int)this_01);
  position = QWidgetLineControl::cursorPosition((QWidgetLineControl *)in_RDI->control);
  QAccessibleTextCursorEvent::setCursorPosition(this_01,position);
  QAccessible::updateAccessibility((QAccessibleEvent *)this_01);
  QAccessibleTextSelectionEvent::~QAccessibleTextSelectionEvent
            ((QAccessibleTextSelectionEvent *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEditPrivate::selectionChanged()
{
    Q_Q(QLineEdit);
    if (control->preeditAreaText().isEmpty()) {
        QStyleOptionFrame opt;
        q->initStyleOption(&opt);
        bool showCursor = control->hasSelectedText() ?
                          q->style()->styleHint(QStyle::SH_BlinkCursorWhenTextSelected, &opt, q):
                          q->hasFocus();
        setCursorVisible(showCursor);
    }

    emit q->selectionChanged();
#if QT_CONFIG(accessibility)
    QAccessibleTextSelectionEvent ev(q, control->selectionStart(), control->selectionEnd());
    ev.setCursorPosition(control->cursorPosition());
    QAccessible::updateAccessibility(&ev);
#endif
}